

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadSideDefs2(MapData *map,FMissingTextureTracker *missingtex)

{
  double *pdVar1;
  undefined8 *puVar2;
  FileReader *pFVar3;
  int iVar4;
  void *buffer;
  side_t *psVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  sector_t_conflict *sec;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  intmapsidedef_t imsd;
  
  pFVar3 = map->MapLumps[3].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(uint)pFVar3->Length;
  }
  buffer = operator_new__(uVar8);
  MapData::Read(map,3,buffer,-1);
  lVar7 = 4;
  lVar6 = 0;
  for (uVar8 = 0; psVar5 = sides, (long)uVar8 < (long)numsides; uVar8 = uVar8 + 1) {
    puVar9 = (uint *)((ulong)*(uint *)((long)&sidetemp->field_0 + lVar7 + 4) * 0x1e + (long)buffer);
    if (gameinfo.gametype == GAME_Strife) {
      iVar4 = strncmp((char *)(puVar9 + 5),"LASERB01",8);
      if (iVar4 == 0) {
        *(short *)((long)puVar9 + 2) = *(short *)((long)puVar9 + 2) + 0x66;
      }
    }
    auVar11 = pshuflw(ZEXT416(*puVar9),ZEXT416(*puVar9),0x60);
    dVar10 = (double)(auVar11._0_4_ >> 0x10);
    dVar12 = (double)(auVar11._4_4_ >> 0x10);
    pdVar1 = (double *)((long)&psVar5->textures[2].xOffset + lVar6);
    *pdVar1 = dVar10;
    pdVar1[1] = dVar12;
    pdVar1 = (double *)((long)&psVar5->textures[1].xOffset + lVar6);
    *pdVar1 = dVar10;
    pdVar1[1] = dVar12;
    pdVar1 = (double *)((long)&psVar5->textures[0].xOffset + lVar6);
    *pdVar1 = dVar10;
    pdVar1[1] = dVar12;
    puVar2 = (undefined8 *)((long)&psVar5->textures[2].xScale + lVar6);
    *puVar2 = 0x3ff0000000000000;
    puVar2[1] = 0x3ff0000000000000;
    puVar2 = (undefined8 *)((long)&psVar5->textures[1].xScale + lVar6);
    *puVar2 = 0x3ff0000000000000;
    puVar2[1] = 0x3ff0000000000000;
    puVar2 = (undefined8 *)((long)&psVar5->textures[0].xScale + lVar6);
    *puVar2 = 0x3ff0000000000000;
    puVar2[1] = 0x3ff0000000000000;
    *(undefined8 *)((long)&psVar5->linedef + lVar6) = 0;
    (&psVar5->Flags)[lVar6] = '\0';
    *(int *)((long)&psVar5->Index + lVar6) = (int)uVar8;
    if ((uint)(int)(short)puVar9[7] < (uint)numsectors) {
      sec = sectors + (int)(short)puVar9[7];
    }
    else {
      Printf(2,"Sidedef %d has a bad sector\n",uVar8 & 0xffffffff);
      sec = (sector_t_conflict *)0x0;
    }
    psVar5 = (side_t *)((long)psVar5->textures + lVar6 + -0x10);
    psVar5->sector = sec;
    imsd.toptexture.Chars = FString::NullString.Nothing;
    imsd.bottomtexture.Chars = FString::NullString.Nothing;
    imsd.midtexture.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 3;
    FString::CopyCStrPart(&imsd.toptexture,(char *)(puVar9 + 1),8);
    FString::CopyCStrPart(&imsd.midtexture,(char *)(puVar9 + 5),8);
    FString::CopyCStrPart(&imsd.bottomtexture,(char *)(puVar9 + 3),8);
    P_ProcessSideTextures
              ((bool)(map->HasBehavior ^ 1),psVar5,sec,&imsd,
               (int)*(short *)((long)sidetemp + lVar7 + -2),
               (int)*(short *)((long)sidetemp + lVar7 + -4),
               (short *)((long)&sidetemp->field_0 + lVar7),missingtex);
    intmapsidedef_t::~intmapsidedef_t(&imsd);
    lVar7 = lVar7 + 0xc;
    lVar6 = lVar6 + 0xc0;
  }
  operator_delete__(buffer);
  return;
}

Assistant:

void P_LoadSideDefs2 (MapData *map, FMissingTextureTracker &missingtex)
{
	int  i;
	char * msdf = new char[map->Size(ML_SIDEDEFS)];
	map->Read(ML_SIDEDEFS, msdf);

	for (i = 0; i < numsides; i++)
	{
		mapsidedef_t *msd = ((mapsidedef_t*)msdf) + sidetemp[i].a.map;
		side_t *sd = sides + i;
		sector_t *sec;

		// [RH] The Doom renderer ignored the patch y locations when
		// drawing mid textures. ZDoom does not, so fix the laser beams in Strife.
		if (gameinfo.gametype == GAME_Strife &&
			strncmp (msd->midtexture, "LASERB01", 8) == 0)
		{
			msd->rowoffset += 102;
		}

		sd->SetTextureXOffset(LittleShort(msd->textureoffset));
		sd->SetTextureYOffset(LittleShort(msd->rowoffset));
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->linedef = NULL;
		sd->Flags = 0;
		sd->Index = i;

		// killough 4/4/98: allow sidedef texture names to be overloaded
		// killough 4/11/98: refined to allow colormaps to work as wall
		// textures if invalid as colormaps but valid as textures.

		if ((unsigned)LittleShort(msd->sector)>=(unsigned)numsectors)
		{
			Printf (PRINT_HIGH, "Sidedef %d has a bad sector\n", i);
			sd->sector = sec = NULL;
		}
		else
		{
			sd->sector = sec = &sectors[LittleShort(msd->sector)];
		}

		intmapsidedef_t imsd;
		imsd.toptexture.CopyCStrPart(msd->toptexture, 8);
		imsd.midtexture.CopyCStrPart(msd->midtexture, 8);
		imsd.bottomtexture.CopyCStrPart(msd->bottomtexture, 8);

		P_ProcessSideTextures(!map->HasBehavior, sd, sec, &imsd, 
							  sidetemp[i].a.special, sidetemp[i].a.tag, &sidetemp[i].a.alpha, missingtex);
	}
	delete[] msdf;
}